

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerSettings.cpp
# Opt level: O3

void __thiscall HdmiCecAnalyzerSettings::HdmiCecAnalyzerSettings(HdmiCecAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *this_00;
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  AnalyzerSettingInterfaceChannel *pAVar4;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__HdmiCecAnalyzerSettings_0010ed70;
  uVar2 = 0xffffffffffffffff;
  Channel::Channel(&this->mCecChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  (this->mCecChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  this_00 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar2);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  pAVar4 = (this->mCecChannelInterface)._M_ptr;
  if (pAVar4 != this_00) {
    if (pAVar4 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar4 + 8))();
    }
    (this->mCecChannelInterface)._M_ptr = this_00;
    pAVar4 = this_00;
  }
  pcVar1 = HdmiCec::GetChannelName();
  HdmiCec::GetFullProtocolName();
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar4,pcVar1);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mCecChannelInterface)._M_ptr);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar3 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar3,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar3,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar3,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  pcVar1 = HdmiCec::GetProtocolName();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mCecChannel,SUB81(pcVar1,0));
  return;
}

Assistant:

HdmiCecAnalyzerSettings::HdmiCecAnalyzerSettings() : mCecChannel( UNDEFINED_CHANNEL )
{
    mCecChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mCecChannelInterface->SetTitleAndTooltip( HdmiCec::GetChannelName(), HdmiCec::GetFullProtocolName() );
    mCecChannelInterface->SetChannel( mCecChannel );

    AddInterface( mCecChannelInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mCecChannel, HdmiCec::GetProtocolName(), false );
}